

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

bool __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::isMeshInterfaceVar
          (BuiltInsValidator *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar5;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *this_01;
  reference pEVar6;
  Instruction *ifxVar;
  bool local_d1;
  Instruction *varInst;
  const_iterator cStack_b8;
  uint interface;
  const_iterator __end6;
  const_iterator __begin6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range6;
  EntryPointDescription *desc;
  const_iterator __end5;
  const_iterator __begin5;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *__range5;
  key_type local_74;
  _Self local_70;
  _Self local_68;
  key_type local_5c;
  _Self local_58;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *local_50;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *models;
  const_iterator cStack_40;
  uint32_t entry_point;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  anon_class_8_1_8991fb9c getUnderlyingTypeId;
  Instruction *inst_local;
  BuiltInsValidator *this_local;
  
  __range3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  getUnderlyingTypeId.this = (BuiltInsValidator *)inst;
  this_00 = ValidationState_t::entry_points(this->_);
  __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
  cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc0);
    if (!bVar1) {
      return false;
    }
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end3);
    models._4_4_ = *puVar5;
    local_50 = ValidationState_t::GetExecutionModels(this->_,models._4_4_);
    local_5c = ExecutionModelMeshEXT;
    local_58._M_node =
         (_Base_ptr)
         std::
         set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
         ::find(local_50,&local_5c);
    local_68._M_node =
         (_Base_ptr)
         std::
         set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
         ::end(local_50);
    bVar1 = std::operator!=(&local_58,&local_68);
    local_d1 = true;
    if (!bVar1) {
      local_74 = ExecutionModelMeshNV;
      local_70._M_node =
           (_Base_ptr)
           std::
           set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
           ::find(local_50,&local_74);
      __range5 = (vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  *)std::
                    set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                    ::end(local_50);
      local_d1 = std::operator!=(&local_70,(_Self *)&__range5);
    }
    if (local_d1 != false) {
      this_01 = ValidationState_t::entry_point_descriptions(this->_,models._4_4_);
      __end5 = std::
               vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
               ::begin(this_01);
      desc = (EntryPointDescription *)
             std::
             vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
             ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
                                         *)&desc), bVar1) {
        pEVar6 = __gnu_cxx::
                 __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
                 ::operator*(&__end5);
        __end6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&pEVar6->interfaces);
        cStack_b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                              (&pEVar6->interfaces);
        while (bVar1 = __gnu_cxx::operator!=(&__end6,&stack0xffffffffffffff48), bVar1) {
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end6);
          uVar3 = *puVar5;
          OVar2 = val::Instruction::opcode((Instruction *)getUnderlyingTypeId.this);
          if (OVar2 == OpTypeStruct) {
            ifxVar = ValidationState_t::FindDef(this->_,uVar3);
            uVar3 = val::Instruction::id((Instruction *)getUnderlyingTypeId.this);
            uVar4 = isMeshInterfaceVar::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)&__range3,ifxVar);
            if (uVar3 == uVar4) {
              return true;
            }
          }
          else {
            uVar4 = val::Instruction::id((Instruction *)getUnderlyingTypeId.this);
            if (uVar4 == uVar3) {
              return true;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end6);
        }
        __gnu_cxx::
        __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
        ::operator++(&__end5);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

bool isMeshInterfaceVar(const Instruction& inst) {
    auto getUnderlyingTypeId = [&](const Instruction* ifxVar) {
      auto pointerTypeInst = _.FindDef(ifxVar->type_id());
      auto typeInst = _.FindDef(pointerTypeInst->GetOperandAs<uint32_t>(2));
      while (typeInst->opcode() == spv::Op::OpTypeArray) {
        typeInst = _.FindDef(typeInst->GetOperandAs<uint32_t>(1));
      };
      return typeInst->id();
    };

    for (const uint32_t entry_point : _.entry_points()) {
      const auto* models = _.GetExecutionModels(entry_point);
      if (models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
          models->find(spv::ExecutionModel::MeshNV) != models->end()) {
        for (const auto& desc : _.entry_point_descriptions(entry_point)) {
          for (auto interface : desc.interfaces) {
            if (inst.opcode() == spv::Op::OpTypeStruct) {
              auto varInst = _.FindDef(interface);
              if (inst.id() == getUnderlyingTypeId(varInst)) return true;
            } else if (inst.id() == interface) {
              return true;
            }
          }
        }
      }
    }
    return false;
  }